

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O2

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deInt64 value)

{
  deUint8 data [8];
  
  data = (deUint8  [8])(value ^ 0xaba0480139f77e2);
  SeedBuilder::feed(builder,8,data);
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deInt64 value)
{
	const deInt64	val		= value ^ 772935234179004386ll;
	const deUint8	data[]	=
	{
		(deUint8)(((deUint64)val) & 0xFFu),
		(deUint8)((((deUint64)val) >> 8) & 0xFFu),
		(deUint8)((((deUint64)val) >> 16) & 0xFFu),
		(deUint8)((((deUint64)val) >> 24) & 0xFFu),

		(deUint8)((((deUint64)val) >> 32) & 0xFFu),
		(deUint8)((((deUint64)val) >> 40) & 0xFFu),
		(deUint8)((((deUint64)val) >> 48) & 0xFFu),
		(deUint8)((((deUint64)val) >> 56) & 0xFFu),
	};

	builder.feed(sizeof(data), data);
	return builder;
}